

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O3

void __thiscall
PeleLM::flux_divergenceRD
          (PeleLM *this,MultiFab *a_state,int stateComp,MultiFab *a_divergence,int divComp,
          MultiFab **a_fluxes,int fluxComp,int nComp,BCRec *d_bc,Real scale,Real a_dt,
          int areSpeciesFluxes)

{
  Box *pBVar1;
  EBCellFlagFab *this_00;
  string redistribution_type;
  string redistribution_type_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  FabType FVar4;
  int iVar5;
  long lVar6;
  FabArray<amrex::EBCellFlagFab> *pFVar7;
  MultiCutFab *this_01;
  FabArray<amrex::FArrayBox> *this_02;
  Arena *arena;
  int *piVar8;
  Geometry *this_03;
  ulong uVar9;
  long lVar10;
  long *plVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  bool bVar17;
  undefined8 uVar18;
  int iVar20;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  Periodicity PVar22;
  undefined8 in_stack_fffffffffffff908;
  int in_stack_fffffffffffff91c;
  Box local_6cc;
  Geometry *local_6b0;
  Real local_6a8;
  long local_6a0;
  long local_698;
  long local_690;
  Box result;
  int local_66c;
  int local_668;
  int local_664;
  int local_660;
  int local_65c;
  Box local_638;
  Array4<double> local_610;
  long *local_5d0 [2];
  long local_5c0 [2];
  long *local_5b0 [2];
  long local_5a0 [2];
  long local_590;
  long local_588;
  ulong local_580;
  long local_578;
  long local_570;
  MFIter mfi;
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  undefined8 local_4e8;
  undefined4 local_4e0;
  undefined1 local_4dc [16];
  Array4<const_amrex::EBCellFlag> local_4c8;
  Array4<double> local_488;
  Array4<double> local_448;
  Elixir eli;
  Array4<const_double> local_3f0;
  Array4<const_double> local_3b0;
  Array4<const_double> fcz;
  Array4<const_double> fcy;
  Array4<const_double> fcx;
  Array4<const_double> apz;
  Array4<const_double> apy;
  Array4<const_double> apx;
  Array4<const_double> local_1f0;
  MultiFab divTemp;
  
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ = 0;
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = 1;
  mfi.fabArray._0_4_ = 0;
  mfi._12_12_ = SUB1612((undefined1  [16])0x0,4);
  mfi.tile_size.vect[2] = 0;
  mfi.flags = '\0';
  mfi._29_3_ = 0;
  mfi.currentIndex = 0;
  mfi.beginIndex = 0;
  local_6a8 = a_dt;
  amrex::MultiFab::MultiFab
            (&divTemp,&(this->super_NavierStokesBase).super_AmrLevel.grids,
             &(this->super_NavierStokesBase).super_AmrLevel.dmap,nComp,
             (a_state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0],
             (MFInfo *)&mfi,
             (this->super_NavierStokesBase).super_AmrLevel.m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi.tile_size);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&divTemp.super_FabArray<amrex::FArrayBox>,0.0,0,
             divTemp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_comp,
             &divTemp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow);
  flux_divergence(this,&divTemp,0,a_fluxes,fluxComp,nComp,scale);
  this_03 = &(this->super_NavierStokesBase).super_AmrLevel.geom;
  PVar22 = amrex::Geometry::periodicity(this_03);
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ =
       (undefined1)PVar22.period.vect[0];
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ = PVar22.period.vect._1_7_;
  mfi.fabArray._0_4_ = PVar22.period.vect[2];
  amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
            (&divTemp.super_FabArray<amrex::FArrayBox>,(Periodicity *)&mfi,false);
  lVar6 = __dynamic_cast((a_state->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                         super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                         _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                         &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (lVar6 == 0) {
    __cxa_bad_cast();
  }
  amrex::MFIter::MFIter(&mfi,(FabArrayBase *)a_divergence,true);
  if (mfi.currentIndex < mfi.endIndex) {
    do {
      local_6a0 = lVar6;
      local_6b0 = this_03;
      lVar6 = local_6a0;
      amrex::MFIter::tilebox(&local_6cc,&mfi);
      pFVar7 = amrex::EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar6 + 0xd8));
      piVar8 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar8 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + mfi.currentIndex;
      }
      this_00 = (pFVar7->m_fabs_v).
                super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
                _M_impl.super__Vector_impl_data._M_start[*piVar8];
      local_4c8.p = (this_00->super_BaseFab<amrex::EBCellFlag>).dptr;
      local_4c8.ncomp = (this_00->super_BaseFab<amrex::EBCellFlag>).nvar;
      pBVar1 = &(this_00->super_BaseFab<amrex::EBCellFlag>).domain;
      local_4c8.begin.z = (this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
      local_4c8.begin.x = (pBVar1->smallend).vect[0];
      local_4c8.begin.y = (pBVar1->smallend).vect[1];
      lVar6 = (long)(this_00->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
      lVar12 = (long)(this_00->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0];
      lVar14 = (long)(this_00->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
      local_4c8.jstride = (lVar12 - (pBVar1->smallend).vect[0]) + 1;
      local_4c8.kstride =
           (lVar6 - (this_00->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1]) *
           local_4c8.jstride;
      local_4c8.nstride = (lVar14 - local_4c8.begin.z) * local_4c8.kstride;
      local_4c8.end._0_8_ = lVar12 + 1U & 0xffffffff | lVar6 << 0x20;
      local_4c8.end.z = (int)lVar14;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_448,&a_divergence->super_FabArray<amrex::FArrayBox>,&mfi,divComp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_488,&divTemp.super_FabArray<amrex::FArrayBox>,&mfi);
      FVar4 = amrex::EBCellFlagFab::getType(this_00,&local_6cc);
      if (FVar4 != covered) {
        result.btype.itype = local_6cc.btype.itype;
        result.smallend.vect[2] = local_6cc.smallend.vect[2] + -4;
        result.bigend.vect[0] = local_6cc.bigend.vect[0] + 4;
        result.smallend.vect[1] = local_6cc.smallend.vect[1] + -4;
        result.smallend.vect[0] = local_6cc.smallend.vect[0] + -4;
        result.bigend.vect[1] = local_6cc.bigend.vect[1] + 4;
        result.bigend.vect[2] = local_6cc.bigend.vect[2] + 4;
        FVar4 = amrex::EBCellFlagFab::getType(this_00,&result);
        lVar6 = local_6a0;
        if (FVar4 == regular) {
          if (0 < nComp) {
            lVar12 = (long)local_6cc.smallend.vect[1];
            scale = (Real)((lVar12 - local_448.begin.y) * local_448.jstride * 8 +
                           (long)local_6cc.smallend.vect[0] * 8 + (long)local_448.begin.x * -8 +
                          (long)local_448.p);
            local_588 = local_448.nstride * 8;
            local_570 = local_448.kstride * 8;
            lVar6 = (lVar12 - local_488.begin.y) * local_488.jstride * 8 +
                    (long)local_6cc.smallend.vect[0] * 8 + (long)local_488.begin.x * -8 +
                    (long)local_488.p;
            local_578 = -(long)local_448.begin.z;
            local_590 = local_488.nstride * 8;
            local_690 = local_488.kstride * 8;
            local_698 = -(long)local_488.begin.z;
            uVar9 = 0;
            do {
              local_580 = uVar9;
              iVar5 = local_6cc.smallend.vect[2];
              if (local_6cc.smallend.vect[2] <= local_6cc.bigend.vect[2]) {
                do {
                  if (local_6cc.smallend.vect[1] <= local_6cc.bigend.vect[1]) {
                    lVar10 = (local_578 + iVar5) * local_570 + (long)scale;
                    lVar13 = (iVar5 + local_698) * local_690 + lVar6;
                    lVar14 = lVar12;
                    do {
                      if (local_6cc.smallend.vect[0] <= local_6cc.bigend.vect[0]) {
                        lVar15 = 0;
                        do {
                          *(undefined8 *)(lVar10 + lVar15 * 8) =
                               *(undefined8 *)(lVar13 + lVar15 * 8);
                          lVar15 = lVar15 + 1;
                        } while ((local_6cc.bigend.vect[0] - local_6cc.smallend.vect[0]) + 1 !=
                                 (int)lVar15);
                      }
                      lVar14 = lVar14 + 1;
                      lVar10 = lVar10 + local_448.jstride * 8;
                      lVar13 = lVar13 + local_488.jstride * 8;
                    } while (local_6cc.bigend.vect[1] + 1 != (int)lVar14);
                  }
                  bVar17 = iVar5 != local_6cc.bigend.vect[2];
                  iVar5 = iVar5 + 1;
                } while (bVar17);
              }
              scale = (Real)((long)scale + local_588);
              lVar6 = lVar6 + local_590;
              uVar9 = local_580 + 1;
              in_stack_fffffffffffff91c = local_6cc.smallend.vect[2];
            } while (local_580 + 1 != (ulong)(uint)nComp);
          }
        }
        else {
          amrex::EBDataCollection::getAreaFrac(*(EBDataCollection **)(local_6a0 + 0xd8));
          amrex::MultiCutFab::const_array(&apx,(MultiCutFab *)result.smallend.vect._0_8_,&mfi);
          amrex::EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar6 + 0xd8));
          amrex::MultiCutFab::const_array
                    (&apy,(MultiCutFab *)CONCAT44(result.bigend.vect[0],result.smallend.vect[2]),
                     &mfi);
          amrex::EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar6 + 0xd8));
          amrex::MultiCutFab::const_array
                    (&apz,(MultiCutFab *)CONCAT44(result.bigend.vect[2],result.bigend.vect[1]),&mfi)
          ;
          amrex::EBDataCollection::getFaceCent(*(EBDataCollection **)(lVar6 + 0xd8));
          amrex::MultiCutFab::const_array(&fcx,(MultiCutFab *)result.smallend.vect._0_8_,&mfi);
          amrex::EBDataCollection::getFaceCent(*(EBDataCollection **)(lVar6 + 0xd8));
          amrex::MultiCutFab::const_array
                    (&fcy,(MultiCutFab *)CONCAT44(result.bigend.vect[0],result.smallend.vect[2]),
                     &mfi);
          amrex::EBDataCollection::getFaceCent(*(EBDataCollection **)(lVar6 + 0xd8));
          amrex::MultiCutFab::const_array
                    (&fcz,(MultiCutFab *)CONCAT44(result.bigend.vect[2],result.bigend.vect[1]),&mfi)
          ;
          this_01 = amrex::EBDataCollection::getCentroid(*(EBDataCollection **)(lVar6 + 0xd8));
          amrex::MultiCutFab::const_array(&local_3b0,this_01,&mfi);
          this_02 = &amrex::EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar6 + 0xd8))->
                     super_FabArray<amrex::FArrayBox>;
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_3f0,this_02,&mfi);
          local_638.smallend.vect[1] = local_6cc.smallend.vect[1];
          local_638.smallend.vect[0] = local_6cc.smallend.vect[0];
          local_638.btype.itype = local_6cc.btype.itype;
          local_638.bigend.vect[2] = local_6cc.bigend.vect[2];
          local_638.bigend.vect[1] = local_6cc.bigend.vect[1];
          local_638.smallend.vect[2] = local_6cc.smallend.vect[2];
          local_638.bigend.vect[0] = local_6cc.bigend.vect[0];
          iVar5 = std::__cxx11::string::compare((char *)&diffusion_redistribution_type_abi_cxx11_);
          if ((iVar5 == 0) ||
             (iVar5 = std::__cxx11::string::compare
                                ((char *)&diffusion_redistribution_type_abi_cxx11_), iVar5 == 0)) {
            iVar5 = local_638.smallend.vect[0] + -3;
            uVar18 = 0x3fffffffd;
LAB_001ac057:
            iVar20 = (int)((ulong)uVar18 >> 0x20);
            local_638.smallend.vect[2] = local_638.smallend.vect[2] + (int)uVar18;
            local_638.bigend.vect[0] = local_638.bigend.vect[0] + iVar20;
            local_638.bigend.vect[1] = local_638.bigend.vect[1] + iVar20;
            local_638.smallend.vect[1] = local_638.smallend.vect[1] + (int)uVar18;
            local_638.smallend.vect[0] = iVar5;
            local_638.bigend.vect[2] = local_638.bigend.vect[2] + iVar20;
          }
          else {
            iVar5 = std::__cxx11::string::compare((char *)&diffusion_redistribution_type_abi_cxx11_)
            ;
            if (iVar5 == 0) {
              iVar5 = local_638.smallend.vect[0] + -2;
              uVar18 = 0x2fffffffe;
              goto LAB_001ac057;
            }
          }
          amrex::FArrayBox::FArrayBox((FArrayBox *)&result,&local_638,nComp,true,false,(Arena *)0x0)
          ;
          arena = (Arena *)CONCAT44(result.bigend.vect[0],result.smallend.vect[2]);
          if (arena == (Arena *)0x0) {
            arena = amrex::The_Arena();
          }
          amrex::Gpu::Elixir::Elixir(&eli,(void *)0x0,arena);
          local_610.p = (double *)CONCAT44(result.bigend.vect[2],result.bigend.vect[1]);
          local_610.begin.x = result.btype.itype;
          local_610.begin.y = local_66c;
          local_610.jstride = ((long)local_664 - (long)(int)result.btype.itype) + 1;
          local_610.kstride = (((long)local_660 + 1) - (long)local_66c) * local_610.jstride;
          local_610.nstride = (((long)local_65c + 1) - (long)local_668) * local_610.kstride;
          local_610.end._0_8_ = (long)local_664 + 1U & 0xffffffff | (long)local_660 + 1 << 0x20;
          local_610.begin.z = local_668;
          local_610.end.z = (int)((long)local_65c + 1);
          iVar5 = std::__cxx11::string::compare((char *)&diffusion_redistribution_type_abi_cxx11_);
          auVar3 = _DAT_0065b9b0;
          auVar2 = _DAT_0065b9a0;
          if ((iVar5 == 0) && (local_610.begin.z < local_610.end.z)) {
            uVar16 = ~local_610.begin.x + local_610.end.x;
            auVar19._4_4_ = 0;
            auVar19._0_4_ = uVar16;
            auVar19._8_4_ = uVar16;
            auVar19._12_4_ = 0;
            auVar19 = auVar19 ^ _DAT_0065b9b0;
            iVar5 = local_610.begin.z;
            do {
              if (local_610.begin.y < local_610.end.y) {
                lVar6 = (long)local_610.p +
                        ((long)iVar5 - (long)local_610.begin.z) * local_610.kstride * 8 + 8;
                iVar20 = local_610.begin.y;
                do {
                  if (local_610.begin.x < local_610.end.x) {
                    uVar9 = 0;
                    do {
                      auVar21._8_4_ = (int)uVar9;
                      auVar21._0_8_ = uVar9;
                      auVar21._12_4_ = (int)(uVar9 >> 0x20);
                      auVar21 = (auVar21 | auVar2) ^ auVar3;
                      if ((bool)(~(auVar19._4_4_ < auVar21._4_4_ ||
                                  auVar19._0_4_ < auVar21._0_4_ && auVar21._4_4_ == auVar19._4_4_) &
                                1)) {
                        *(undefined8 *)(lVar6 + (uVar9 - 1) * 8) = 0x3ff0000000000000;
                      }
                      if (auVar21._12_4_ <= auVar19._12_4_ &&
                          (auVar21._8_4_ <= auVar19._8_4_ || auVar21._12_4_ != auVar19._12_4_)) {
                        *(undefined8 *)(lVar6 + uVar9 * 8) = 0x3ff0000000000000;
                      }
                      uVar9 = uVar9 + 2;
                    } while (((ulong)uVar16 + 2 & 0xfffffffffffffffe) != uVar9);
                  }
                  iVar20 = iVar20 + 1;
                  lVar6 = lVar6 + local_610.jstride * 8;
                } while (local_610.end.y != iVar20);
              }
              bVar17 = iVar5 != local_610.end.z + -1;
              iVar5 = iVar5 + 1;
            } while (bVar17);
          }
          if (areSpeciesFluxes == 0) {
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_1f0,&a_state->super_FabArray<amrex::FArrayBox>,&mfi,stateComp);
            local_5d0[0] = local_5c0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_5d0,diffusion_redistribution_type_abi_cxx11_._M_dataplus._M_p
                       ,diffusion_redistribution_type_abi_cxx11_._M_dataplus._M_p +
                        diffusion_redistribution_type_abi_cxx11_._M_string_length);
            local_4f8 = (undefined1  [16])0x0;
            local_508 = (undefined1  [16])0x0;
            local_4e8 = 0x100000001;
            local_4e0 = 1;
            local_4dc = (undefined1  [16])0x0;
            redistribution_type_00._M_string_length = 2;
            redistribution_type_00._M_dataplus._M_p = (pointer)local_5d0;
            redistribution_type_00.field_2._M_allocated_capacity = (size_type)local_508;
            redistribution_type_00.field_2._8_8_ = in_stack_fffffffffffff908;
            Redistribution::Apply
                      (&local_6cc,nComp,&local_448,&local_488,&local_1f0,&local_610,&local_4c8,&apx,
                       &apy,&apz,&local_3f0,&fcx,&fcy,&fcz,&local_3b0,d_bc,local_6b0,local_6a8,
                       redistribution_type_00,SUB84(scale,0),0.5,
                       (Array4<const_double> *)CONCAT44(in_stack_fffffffffffff91c,stateComp));
            lVar6 = local_5c0[0];
            plVar11 = local_5d0[0];
            if (local_5d0[0] != local_5c0) goto LAB_001ac799;
          }
          else {
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_1f0,&a_state->super_FabArray<amrex::FArrayBox>,&mfi,stateComp);
            local_5b0[0] = local_5a0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_5b0,diffusion_redistribution_type_abi_cxx11_._M_dataplus._M_p
                       ,diffusion_redistribution_type_abi_cxx11_._M_dataplus._M_p +
                        diffusion_redistribution_type_abi_cxx11_._M_string_length);
            local_4f8 = (undefined1  [16])0x0;
            local_508 = (undefined1  [16])0x0;
            local_4e8 = 0x100000001;
            local_4e0 = 1;
            local_4dc = (undefined1  [16])0x0;
            redistribution_type._M_string_length = 2;
            redistribution_type._M_dataplus._M_p = (pointer)local_5b0;
            redistribution_type.field_2._M_allocated_capacity = (size_type)local_508;
            redistribution_type.field_2._8_8_ = in_stack_fffffffffffff908;
            Redistribution::Apply
                      (&local_6cc,nComp,&local_448,&local_488,&local_1f0,&local_610,&local_4c8,&apx,
                       &apy,&apz,&local_3f0,&fcx,&fcy,&fcz,&local_3b0,d_bc,local_6b0,local_6a8,
                       redistribution_type,SUB84(scale,0),0.5,
                       (Array4<const_double> *)CONCAT44(in_stack_fffffffffffff91c,stateComp));
            lVar6 = local_5a0[0];
            plVar11 = local_5b0[0];
            if (local_5b0[0] != local_5a0) {
LAB_001ac799:
              operator_delete(plVar11,lVar6 + 1);
            }
          }
          amrex::Gpu::Elixir::~Elixir(&eli);
          result.smallend.vect._0_8_ = &PTR__BaseFab_00712bd8;
          amrex::BaseFab<double>::clear((BaseFab<double> *)&result);
        }
      }
      amrex::MFIter::operator++(&mfi);
      this_03 = local_6b0;
      lVar6 = local_6a0;
    } while (mfi.currentIndex < mfi.endIndex);
  }
  amrex::MFIter::~MFIter(&mfi);
  amrex::EB_set_covered(a_divergence,0.0);
  amrex::MultiFab::~MultiFab(&divTemp);
  return;
}

Assistant:

void
PeleLM::flux_divergenceRD(const MultiFab        &a_state,
                          int                    stateComp,
                          MultiFab              &a_divergence,
                          int                    divComp,
                          const MultiFab* const* a_fluxes,
                          int                    fluxComp,
                          int                    nComp,
                          BCRec const*           d_bc,
                          Real                   scale,
                          Real                   a_dt,
                          int areSpeciesFluxes)
{
#ifdef AMREX_USE_EB
   // Temporary divTemp to allow fillBoundary
   MultiFab divTemp(grids,dmap,nComp,a_state.nGrow(),MFInfo(),Factory());
   divTemp.setVal(0.0);

   // Call face-centroid extensive fluxes divergence with scaling
   flux_divergence(divTemp, 0, a_fluxes, fluxComp, nComp, scale);

   // FillBoundary
   divTemp.FillBoundary(geom.periodicity());

   // Redistribution
   auto const& ebfact= dynamic_cast<EBFArrayBoxFactory const&>(a_state.Factory());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(a_divergence, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        auto const& bx = mfi.tilebox();
        auto const& flagfab  = ebfact.getMultiEBCellFlagFab()[mfi];
        auto const& flag     = flagfab.const_array();
        auto const& div_arr  = a_divergence.array(mfi, divComp);
        auto const& divT_arr = divTemp.array(mfi);
        if (flagfab.getType(bx) != FabType::covered ) {
            if (flagfab.getType(grow(bx,4)) != FabType::regular) {
                //
                // Redistribute
                //
                AMREX_D_TERM( auto apx = ebfact.getAreaFrac()[0]->const_array(mfi);,
                              auto apy = ebfact.getAreaFrac()[1]->const_array(mfi);,
                              auto apz = ebfact.getAreaFrac()[2]->const_array(mfi); );

                AMREX_D_TERM( Array4<Real const> fcx = ebfact.getFaceCent()[0]->const_array(mfi);,
                              Array4<Real const> fcy = ebfact.getFaceCent()[1]->const_array(mfi);,
                              Array4<Real const> fcz = ebfact.getFaceCent()[2]->const_array(mfi););

                auto const &ccc       = ebfact.getCentroid().const_array(mfi);
                auto const &vfrac_arr = ebfact.getVolFrac().const_array(mfi);

                // This is scratch space if calling StateRedistribute,
                //  but is used as the weights (here set to 1) if calling
                //  FluxRedistribute
                Box gbx = bx;

                if (diffusion_redistribution_type == "StateRedist" || 
                    diffusion_redistribution_type == "NewStateRedist")
                  gbx.grow(3);
                else if (diffusion_redistribution_type == "FluxRedist")
                  gbx.grow(2);

                FArrayBox tmpfab(gbx, nComp);
                Elixir eli = tmpfab.elixir();
                Array4<Real> scratch = tmpfab.array(0);
                if (diffusion_redistribution_type == "FluxRedist")
                {
                    amrex::ParallelFor(Box(scratch),
                    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                    { scratch(i,j,k) = 1.;});
                }

                if (areSpeciesFluxes) {
                    // Placeholder for eventual species-specific treatment of the redistribution
                    Redistribution::Apply( bx, nComp, div_arr, divT_arr,
                                           a_state.const_array(mfi, stateComp), scratch, flag,
                                           AMREX_D_DECL(apx,apy,apz), vfrac_arr,
                                           AMREX_D_DECL(fcx,fcy,fcz), ccc, d_bc,
                                           geom, a_dt, diffusion_redistribution_type );
                } else {
                    Redistribution::Apply( bx, nComp, div_arr, divT_arr,
                                           a_state.const_array(mfi, stateComp), scratch, flag,
                                           AMREX_D_DECL(apx,apy,apz), vfrac_arr,
                                           AMREX_D_DECL(fcx,fcy,fcz), ccc, d_bc,
                                           geom, a_dt, diffusion_redistribution_type );
                }
            } else {
                // Move from divTmp to outgoing MF
                ParallelFor(bx, nComp, [div_arr, divT_arr]
                AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { div_arr( i, j, k, n ) =  divT_arr(i,j,k,n); });
            }
        }
    }

   EB_set_covered(a_divergence,0.);
#else

   // Call face-centroid extensive fluxes divergence with scaling
   flux_divergence(a_divergence, divComp, a_fluxes, fluxComp, nComp, scale);

#endif
}